

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPixmapIconEngineEntry>::relocate
          (QArrayDataPointer<QPixmapIconEngineEntry> *this,qsizetype offset,
          QPixmapIconEngineEntry **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QPixmapIconEngineEntry> *in_RDI;
  QPixmapIconEngineEntry **unaff_retaddr;
  QPixmapIconEngineEntry *res;
  QPixmapIconEngineEntry *first;
  QArrayDataPointer<QPixmapIconEngineEntry> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QPixmapIconEngineEntry,long_long>
            (first,(longlong)in_RDI,(QPixmapIconEngineEntry *)0x2966f7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QPixmapIconEngineEntry>,QPixmapIconEngineEntry_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x40 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }